

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O1

void entry_prog_sidhe_ankle(ROOM_INDEX_DATA *room,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  AFFECT_DATA af;
  
  bVar1 = is_affected_by(ch,0x13);
  if (!bVar1) {
    bVar1 = is_npc(ch);
    if (!bVar1) {
      bVar1 = is_immortal(ch);
      if (!bVar1) {
        iVar2 = number_percent();
        if (0x3b < iVar2) {
          send_to_char("You feel a sharp pain in your ankle as your foot slips on a loose rock.\n\r"
                       ,ch);
          act("$n winces in pain as $e twists his ankle on a loose rock.",ch,(void *)0x0,(void *)0x0
              ,0);
          iVar2 = dice((int)ch->level,2);
          damage_new(ch,ch,iVar2,-1,1,true,false,0,1,"twisted ankle");
          iVar2 = number_percent();
          if ((iVar2 < 0x14) && (0 < ch->legs)) {
            send_to_char("You feel a brutal *crack* as your weight comes down on your twisted ankle.\n\r"
                         ,ch);
            init_affect(&af);
            af.where = 0;
            af.duration = 0xc;
            af.type = gsn_hobble;
            af.level = ch->level;
            af.aftype = 3;
            af.location = 2;
            af.modifier = -4;
            affect_to_char(ch,&af);
            af.location = 0x21;
            af.modifier = -1;
            af.aftype = 5;
            affect_to_char(ch,&af);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void entry_prog_sidhe_ankle(ROOM_INDEX_DATA *room, CHAR_DATA *ch)
{
	AFFECT_DATA af;

	if (is_affected_by(ch, AFF_FLYING))
		return;

	if (is_npc(ch) || is_immortal(ch))
		return;

	if (number_percent() < 60)
		return;

	send_to_char("You feel a sharp pain in your ankle as your foot slips on a loose rock.\n\r", ch);
	act("$n winces in pain as $e twists his ankle on a loose rock.", ch, 0, 0, TO_ROOM);

	damage_new(ch, ch, dice(ch->level, 2), TYPE_UNDEFINED, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "twisted ankle");

	if (number_percent() < 20 && ch->legs > 0)
	{
		send_to_char("You feel a brutal *crack* as your weight comes down on your twisted ankle.\n\r", ch);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.duration = 12;
		af.type = gsn_hobble;
		af.level = ch->level;
		af.aftype = AFT_MALADY;
		af.location = APPLY_DEX;
		af.modifier = -4;
		affect_to_char(ch, &af);

		af.location = APPLY_LEGS;
		af.modifier = -1;
		af.aftype = AFT_INVIS;
		affect_to_char(ch, &af);
	}
}